

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_escaping.cc
# Opt level: O3

void google::protobuf::util::converter::JsonEscaping::Escape(ByteSource *input,ByteSink *output)

{
  bool bVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined5 uVar4;
  byte bVar5;
  undefined1 uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t size;
  undefined4 extraout_var_01;
  int iVar8;
  long extraout_RDX;
  char *__s;
  long i;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  StringPiece local_80;
  ByteSink *local_70;
  ByteSource *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  char buffer [12];
  
  local_40 = 0x755c64616564755c;
  builtin_strncpy(buffer,"bee",4);
  local_70 = output;
  iVar7 = (*input->_vptr_ByteSource[2])();
  if (CONCAT44(extraout_var,iVar7) != 0) {
    uVar13 = 0;
    uVar12 = 0;
    local_48 = (ulong)local_48._4_4_ << 0x20;
    local_68 = input;
    do {
      iVar7 = (*input->_vptr_ByteSource[3])();
      __s = (char *)0x0;
      uVar10 = 0;
      do {
        uVar11 = 0;
        iVar8 = (int)uVar10;
        local_80.ptr_ = (char *)CONCAT44(extraout_var_00,iVar7);
        local_80.length_ = extraout_RDX;
        local_58 = uVar10;
        if (uVar12 == 0) {
          bVar5 = StringPiece::operator[](&local_80,(long)iVar8);
          uVar13 = (uint)bVar5;
          if ((char)bVar5 < '\0') {
            uVar11 = 1;
            if (0xbf < bVar5) {
              iVar8 = (int)local_58 + 1;
              if (bVar5 < 0xe0) {
                uVar13 = uVar13 & 0x1f;
                uVar12 = 1;
                uVar11 = 1;
              }
              else if (bVar5 < 0xf0) {
                uVar13 = uVar13 & 0xf;
                uVar11 = 1;
                uVar12 = 2;
              }
              else {
                if (0xf7 < bVar5) goto LAB_0030c6d7;
                uVar13 = uVar13 & 7;
                uVar11 = 1;
                uVar12 = 3;
              }
              goto LAB_0030c31f;
            }
LAB_0030c6d7:
            uVar12 = 0;
            bVar1 = false;
            local_50 = __s;
LAB_0030c6e0:
            local_48 = 0;
            uVar10 = local_58;
            input = local_68;
            goto LAB_0030c6f0;
          }
          uVar12 = 0;
          uVar11 = 1;
        }
        else {
LAB_0030c31f:
          local_5c = (int)uVar12 >> 0x1f & uVar12;
          local_60 = ((int)uVar11 + uVar12) - local_5c;
          i = (long)iVar8;
          local_50 = __s;
          while (local_5c != uVar12) {
            bVar1 = local_80.length_ <= i;
            if (local_80.length_ <= i) goto LAB_0030c6e0;
            bVar5 = StringPiece::operator[](&local_80,i);
            uVar12 = uVar12 - 1;
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar13 = uVar13 << 6 | (uint)(bVar5 & 0x3f);
            i = i + 1;
            if (-0x41 < (char)bVar5) goto LAB_0030c6e0;
          }
          bVar1 = false;
          input = local_68;
          uVar10 = local_58;
          uVar12 = local_5c;
          if (0x10ffff < uVar13) {
            local_48 = 0;
            uVar11 = (ulong)local_60;
            goto LAB_0030c6f0;
          }
          uVar11 = (ulong)local_60;
          if ((uVar13 & 0xfffff800) == 0xd800) {
            local_48 = 0;
            goto LAB_0030c6f0;
          }
        }
        input = local_68;
        iVar8 = (int)local_58;
        if (0x9f < uVar13) {
          uVar4 = (undefined5)local_40;
          uVar3 = (undefined2)local_40;
          if ((int)uVar13 < 0xfeff) {
            if ((int)uVar13 < 0x17b4) {
              if (((uVar13 != 0xad) && (uVar13 != 0x6dd)) && (uVar13 != 0x70f)) goto LAB_0030c4e3;
              goto LAB_0030c59f;
            }
            if (uVar13 - 0x17b4 < 2) goto LAB_0030c59f;
LAB_0030c4e3:
            if ((((uVar13 & 0xfffffffc) == 0x600) ||
                ((uVar13 - 0x200b < 0x24 &&
                 ((0xfe000001fU >> ((ulong)(uVar13 - 0x200b) & 0x3f) & 1) != 0)))) ||
               ((uVar13 - 0x2060 < 0x10 && ((0xfc1fU >> (uVar13 - 0x2060 & 0x1f) & 1) != 0))))
            goto LAB_0030c59f;
            if (((0x5f < uVar13 - 0xe0020) && (7 < uVar13 - 0x1d173)) && (uVar13 != 0xe0001)) {
              if (0 < (int)local_48) {
                uVar10 = CONCAT26(local_40._6_2_,CONCAT15((char)uVar13,uVar4)) & 0xffff3fffffffffff;
                local_40 = uVar10 | 0x800000000000;
                uVar6 = (undefined1)(uVar13 >> 6);
                if (uVar13 < 0x800) goto LAB_0030c6b2;
                local_40._0_4_ = (undefined4)uVar10;
                uVar10 = CONCAT35(local_40._5_3_,CONCAT14(uVar6,(undefined4)local_40)) &
                         0xffffff3fffffffff;
                uVar2 = (undefined4)(uVar10 >> 0x20);
                uVar6 = (undefined1)(uVar13 >> 0xc);
                local_40._0_3_ = (undefined3)uVar10;
                if (uVar13 < 0x10000) {
                  local_40 = CONCAT44(uVar2,CONCAT13(uVar6,(undefined3)local_40)) | 0x80e0000000;
                  local_48 = 3;
                  local_50 = (char *)((long)&local_40 + 3);
                }
                else {
                  uVar10 = CONCAT44(uVar2,CONCAT13(uVar6,(undefined3)local_40)) & 0xffffffff3fffffff
                  ;
                  local_40._0_2_ = (undefined2)uVar10;
                  local_40 = CONCAT53((int5)(uVar10 >> 0x18),
                                      CONCAT12((char)(uVar13 >> 0x12),(undefined2)local_40)) |
                             0x8080f00000;
                  local_48 = 4;
                  local_50 = (char *)((long)&local_40 + 2);
                }
                goto LAB_0030c5ec;
              }
              __s = (char *)0x0;
              goto LAB_0030c563;
            }
            uVar9 = (uVar13 >> 10) - 0x2840;
            buffer[3] = "0123456789abcdef"[uVar13 & 0xf];
            buffer[2] = "0123456789abcdef"[uVar13 >> 4 & 0xf];
            buffer[1] = "0123456789abcdef"[(ulong)(uVar13 >> 8 & 3) + 0xc];
            buffer[0] = 'd';
            local_40._0_6_ = CONCAT15("0123456789abcdef"[uVar13 >> 10 & 0xf],uVar4);
            local_40._0_3_ = CONCAT12("0123456789abcdef"[(uVar9 & 0xffff) >> 0xc],uVar3);
            local_40 = CONCAT53(CONCAT41(CONCAT31(local_40._5_3_,
                                                  "0123456789abcdef"[uVar9 >> 4 & 0xf]),
                                         "0123456789abcdef"[uVar9 >> 8 & 0xf]),(undefined3)local_40)
            ;
            local_48 = 0xc;
          }
          else {
            if ((2 < uVar13 - 0xfff9) && (uVar13 != 0xfeff)) goto LAB_0030c4e3;
LAB_0030c59f:
            local_40._0_6_ = CONCAT15("0123456789abcdef"[uVar13 & 0xf],uVar4);
            local_40._0_3_ = CONCAT12("0123456789abcdef"[(uVar13 & 0xffff) >> 0xc],uVar3);
            local_40 = CONCAT53(CONCAT41(CONCAT31(local_40._5_3_,
                                                  "0123456789abcdef"[uVar13 >> 4 & 0xf]),
                                         "0123456789abcdef"[uVar13 >> 8 & 0xf]),(undefined3)local_40
                               );
            local_48 = 6;
          }
          local_50 = (char *)&local_40;
LAB_0030c5ec:
          bVar1 = true;
          uVar10 = local_58;
          goto LAB_0030c6f0;
        }
        __s = (anonymous_namespace)::kCommonEscapes + (ulong)uVar13 * 7;
        size = strlen(__s);
        if ((long)size < 0) {
          local_50 = __s;
          local_48 = size;
          StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
          bVar1 = true;
          uVar10 = local_58;
          goto LAB_0030c6f0;
        }
        if ((0 < (int)local_48) && (size == 0)) {
          local_40 = CONCAT26(local_40._6_2_,CONCAT15((char)uVar13,(undefined5)local_40)) &
                     0xffff3fffffffffff | 0x800000000000;
          uVar6 = (undefined1)(uVar13 >> 6);
LAB_0030c6b2:
          local_40 = CONCAT35(local_40._5_3_,CONCAT14(uVar6,(undefined4)local_40)) | 0xc000000000;
          local_48 = 2;
          local_50 = (char *)((long)&local_40 + 4);
          goto LAB_0030c5ec;
        }
        iVar8 = (int)local_58;
        if (size != 0) {
          bVar1 = true;
          uVar10 = local_58;
          local_50 = __s;
          local_48 = size;
          goto LAB_0030c6f0;
        }
LAB_0030c563:
        uVar9 = iVar8 + (int)uVar11;
        uVar10 = (ulong)uVar9;
      } while ((int)uVar9 < extraout_RDX);
      local_48 = 0;
      bVar1 = true;
      uVar11 = 0;
      local_50 = __s;
LAB_0030c6f0:
      if (0 < (int)uVar10) {
        (*input->_vptr_ByteSource[5])(input,local_70,uVar10 & 0xffffffff);
      }
      if (0 < (int)uVar11) {
        (*input->_vptr_ByteSource[4])(input,uVar11);
      }
      if (bVar1) {
        if (uVar12 == 0) {
          if (local_48 != 0) {
            (*local_70->_vptr_ByteSink[2])(local_70,local_50);
          }
          goto LAB_0030c734;
        }
      }
      else {
LAB_0030c734:
        uVar12 = 0;
      }
      iVar7 = (*input->_vptr_ByteSource[2])(input);
      local_48 = CONCAT44(local_48._4_4_,uVar12);
    } while (CONCAT44(extraout_var_01,iVar7) != 0);
  }
  return;
}

Assistant:

void JsonEscaping::Escape(strings::ByteSource* input,
                          strings::ByteSink* output) {
  char buffer[12] = "\\udead\\ubee";
  uint32 cp = 0;     // Current unicode code point.
  int num_left = 0;  // Num of chars to read to complete the code point.
  while (input->Available() > 0) {
    StringPiece str = input->Peek();
    StringPiece escaped;
    int i = 0;
    int num_read;
    bool ok;
    bool cp_was_split = num_left > 0;
    // Loop until we encounter either
    //   i) a code point that needs to be escaped; or
    //  ii) a split code point is completely read; or
    // iii) a character that is not a valid utf8; or
    //  iv) end of the StringPiece str is reached.
    do {
      ok = ReadCodePoint(str, i, &cp, &num_left, &num_read);
      if (num_left > 0 || !ok) break;  // case iii or iv
      escaped = EscapeCodePoint(cp, buffer, cp_was_split);
      if (!escaped.empty()) break;  // case i or ii
      i += num_read;
      num_read = 0;
    } while (i < str.length());  // case iv
    // First copy the un-escaped prefix, if any, to the output ByteSink.
    if (i > 0) input->CopyTo(output, i);
    if (num_read > 0) input->Skip(num_read);
    if (!ok) {
      // Case iii: Report error.
      // TODO(wpoon): Add error reporting.
      num_left = 0;
    } else if (num_left == 0 && !escaped.empty()) {
      // Case i or ii: Append the escaped code point to the output ByteSink.
      output->Append(escaped.data(), escaped.size());
    }
  }
  if (num_left > 0) {
    // Treat as case iii: report error.
    // TODO(wpoon): Add error reporting.
  }
}